

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

uint ON_SubDMeshFragmentGrid::SetQuads
               (uint side_segment_count,uint level_of_detail,uint *quads,size_t quad_capacity,
               size_t quad_stride,uint *sides,size_t side_capacity,size_t side_stride)

{
  uint uVar1;
  uint *puVar2;
  bool bVar3;
  int iVar4;
  byte bVar5;
  uint *puVar6;
  int iVar7;
  uint uVar8;
  uint uVar10;
  uint uVar11;
  ulong uVar9;
  
  bVar3 = ON_SubDMeshFragment::SideSegmentCountIsValid(side_segment_count);
  if (bVar3) {
    uVar8 = 0;
    if ((level_of_detail != 0 && 1 < side_segment_count) &&
       (uVar8 = level_of_detail,
       side_segment_count >> ((byte)level_of_detail & 0x1f) == 0 || 0x1f < level_of_detail)) {
      uVar10 = 1;
      do {
        uVar8 = uVar10;
        uVar10 = uVar8 * 2;
      } while (uVar8 * 2 < side_segment_count);
    }
    bVar5 = (byte)uVar8;
    iVar7 = 1 << (bVar5 & 0x1f);
    iVar4 = side_segment_count + 1 << (bVar5 & 0x1f);
    uVar8 = side_segment_count >> (bVar5 & 0x1f);
    uVar9 = (ulong)uVar8;
    if (quads != (uint *)0x0 || quad_capacity != 0) {
      if ((quad_stride < 4) || (quad_capacity < uVar8 * uVar8)) goto LAB_00609525;
      for (uVar10 = 0; uVar10 != uVar8; uVar10 = uVar10 + 1) {
        uVar11 = uVar10 * iVar4;
        puVar2 = quads + uVar9 * quad_stride;
        for (; quads < puVar2; quads = quads + quad_stride) {
          *quads = uVar11;
          quads[3] = iVar4 + uVar11;
          uVar1 = iVar4 + iVar7 + uVar11;
          uVar11 = uVar11 + iVar7;
          quads[1] = uVar11;
          quads[2] = uVar1;
        }
      }
    }
    if (sides != (uint *)0x0 || side_capacity != 0) {
      if ((side_stride == 0) || (side_capacity < uVar8 * 4 + 1)) goto LAB_00609525;
      puVar2 = sides + uVar9;
      uVar10 = 0;
      for (; sides < puVar2; sides = sides + side_stride) {
        *sides = uVar10;
        uVar10 = uVar10 + iVar7;
      }
      puVar2 = sides + uVar9;
      for (; sides < puVar2; sides = sides + side_stride) {
        *sides = uVar10;
        uVar10 = uVar10 + iVar4;
      }
      puVar2 = sides + uVar9;
      puVar6 = puVar2;
      for (; sides < puVar2; sides = sides + side_stride) {
        *sides = uVar10;
        uVar10 = uVar10 - iVar7;
        puVar6 = puVar6 + side_stride;
      }
      for (; sides < puVar6; sides = sides + side_stride) {
        *sides = uVar10;
        uVar10 = uVar10 - iVar4;
      }
      *sides = 0;
    }
    uVar8 = uVar8 * uVar8;
  }
  else {
LAB_00609525:
    ON_SubDIncrementErrorCount();
    uVar8 = 0;
  }
  return uVar8;
}

Assistant:

unsigned int ON_SubDMeshFragmentGrid::SetQuads(
  unsigned int side_segment_count,
  unsigned int level_of_detail,
  unsigned int* quads,
  size_t quad_capacity,
  size_t quad_stride,
  unsigned int* sides,
  size_t side_capacity,
  size_t side_stride
)
{
  if ( false == ON_SubDMeshFragment::SideSegmentCountIsValid(side_segment_count) )
    return ON_SUBD_RETURN_ERROR(0);

  if ( side_segment_count <= 1 )
    level_of_detail = 0;
  else if (level_of_detail > 0)
  {
    if (level_of_detail >= 32 || 1U << level_of_detail > side_segment_count)
    {
      level_of_detail = 1;
      while ( 2*level_of_detail < side_segment_count )
        level_of_detail*= 2;
    }
  }


  const unsigned int side_point_count = (side_segment_count+1);
  const unsigned int P_di = (1 << level_of_detail);
  const unsigned int P_dj = P_di*side_point_count;

  const unsigned int side_quad_count = side_segment_count / P_di;

  if (quad_capacity > 0 || nullptr != quads)
  {
    if ( quad_stride < 4 )
      return ON_SUBD_RETURN_ERROR(0);
    if (side_quad_count*side_quad_count > quad_capacity)
      return ON_SUBD_RETURN_ERROR(0);

    unsigned int* fvi = quads;
    for (unsigned int n = 0; n < side_quad_count; n++)
    {
      unsigned int vi0 = n*P_dj;
      unsigned int vi1 = vi0 + P_dj;
      for (const unsigned int* fvi1 = fvi + quad_stride*side_quad_count; fvi < fvi1; fvi += quad_stride)
      {
        fvi[0] = vi0;
        fvi[3] = vi1;
        vi0 += P_di;
        vi1 += P_di;
        fvi[1] = vi0;
        fvi[2] = vi1;
      }
    }
  }

  if (side_capacity > 0 || nullptr != sides)
  {
    if ( side_stride < 1 )
      return ON_SUBD_RETURN_ERROR(0);
    if (side_capacity < 4*side_quad_count +1 )
      return ON_SUBD_RETURN_ERROR(0);

    unsigned int vi = 0;

    for (unsigned int* sides1 = sides + side_quad_count; sides < sides1; sides += side_stride)
    {
      *sides = vi;
      vi += P_di;
    }

    for (unsigned int* sides1 = sides + side_quad_count; sides < sides1; sides += side_stride)
    {
      *sides = vi;
      vi += P_dj;
    }

    for (unsigned int* sides1 = sides + side_quad_count; sides < sides1; sides += side_stride)
    {
      *sides = vi;
      vi -= P_di;
    }

    for (unsigned int* sides1 = sides + side_quad_count; sides < sides1; sides += side_stride)
    {
      *sides = vi;
      vi -= P_dj;
    }

    *sides = 0;
  }

  return side_quad_count*side_quad_count;
}